

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *makeProgram,
          string *param_2,string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,bool fast,int jobs,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> *ptVar1;
  cmake *pcVar2;
  PositionType PVar3;
  pointer pbVar4;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar5;
  undefined8 __p;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> this_00;
  string *psVar6;
  cmState *this_01;
  pointer pbVar7;
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  GeneratedMakeCommand makeCommand;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> mfu;
  undefined1 local_b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tname;
  string local_68;
  cmStateSnapshot local_48;
  
  mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true>)
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
  ptVar1 = (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> *)
           (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ptVar1 == (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> *)
                (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    PVar3 = (pcVar2->CurrentSnapshot).Position.Position;
    makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = (undefined1)PVar3;
    makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)(PVar3 >> 8);
    makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(pcVar2->CurrentSnapshot).State;
    pcVar5 = (pcVar2->CurrentSnapshot).Position.Tree;
    makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(pcVar5,0);
    makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)pcVar5 >> 8);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b8,(cmStateSnapshot *)&makeCommand);
    psVar6 = cmake::GetHomeDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_b8,psVar6);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b8,(cmStateSnapshot *)&makeCommand);
    psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_b8,psVar6);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&makeCommand);
    tname._M_dataplus._M_p = (pointer)this;
    std::make_unique<cmMakefile,cmGlobalUnixMakefileGenerator3*,cmStateSnapshot&>
              ((cmGlobalUnixMakefileGenerator3 **)local_b8,(cmStateSnapshot *)&tname);
    __p = local_b8._0_8_;
    local_b8._0_8_ = (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
    std::__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>::reset
              ((__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> *)&mfu,(pointer)__p);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_b8);
    this_00._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
         (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)mfu;
  }
  else {
    this_00._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
         (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)
         *(tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> *)
          &ptVar1->super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>;
  }
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.RequiresOutputForward = false;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  if (verbose) {
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               psVar6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [4])"env");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [10])"VERBOSE=1");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tname,"",(allocator<char> *)&local_68);
  cmGlobalGenerator::SelectMakeProgram
            ((string *)local_b8,(cmGlobalGenerator *)this,makeProgram,&tname);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&tname);
  if (jobs != -1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [3])"-j");
    if (jobs != 0) {
      std::__cxx11::to_string((string *)local_b8,jobs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  cmAppend<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&makeCommand,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pbVar4 = (targetNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (targetNames->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar4; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::string((string *)&tname,(string *)pbVar7);
    if (tname._M_string_length != 0) {
      if (fast) {
        std::__cxx11::string::append((char *)&tname);
      }
      cmMakefile::GetStateSnapshot
                ((cmMakefile *)
                 this_00._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                 .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b8,&local_48);
      this_01 = cmMakefile::GetState
                          ((cmMakefile *)
                           this_00._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
      psVar6 = cmState::GetBinaryDirectory_abi_cxx11_(this_01);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_68,(cmStateDirectory *)local_b8,psVar6,&tname);
      std::__cxx11::string::operator=((string *)&tname,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      cmSystemTools::ConvertToOutputSlashes(&tname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
                 &tname);
    }
    std::__cxx11::string::~string((string *)&tname);
  }
  local_b8._8_8_ =
       CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  local_b8._0_8_ =
       makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8._16_8_ =
       CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_b8[0x18] = makeCommand.super_GeneratedMakeCommand.RequiresOutputForward;
  __l._M_len = 1;
  __l._M_array = (iterator)local_b8;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,(allocator_type *)&tname);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&makeCommand);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&mfu);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& /*projectName*/,
  const std::string& /*projectDir*/,
  std::vector<std::string> const& targetNames, const std::string& /*config*/,
  bool fast, int jobs, bool verbose,
  std::vector<std::string> const& makeOptions)
{
  std::unique_ptr<cmMakefile> mfu;
  cmMakefile* mf;
  if (!this->Makefiles.empty()) {
    mf = this->Makefiles[0];
  } else {
    cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(
      this->CMakeInstance->GetHomeDirectory());
    snapshot.GetDirectory().SetCurrentBinary(
      this->CMakeInstance->GetHomeOutputDirectory());
    snapshot.SetDefaultDefinitions();
    mfu = cm::make_unique<cmMakefile>(this, snapshot);
    mf = mfu.get();
  }

  GeneratedMakeCommand makeCommand;

  // Make it possible to set verbosity also from command line
  if (verbose) {
    makeCommand.Add(cmSystemTools::GetCMakeCommand());
    makeCommand.Add("-E");
    makeCommand.Add("env");
    makeCommand.Add("VERBOSE=1");
  }
  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    makeCommand.Add("-j");
    if (jobs != cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add(std::to_string(jobs));
    }
  }

  makeCommand.Add(makeOptions.begin(), makeOptions.end());
  for (auto tname : targetNames) {
    if (!tname.empty()) {
      if (fast) {
        tname += "/fast";
      }
      tname =
        mf->GetStateSnapshot().GetDirectory().ConvertToRelPathIfNotContained(
          mf->GetState()->GetBinaryDirectory(), tname);
      cmSystemTools::ConvertToOutputSlashes(tname);
      makeCommand.Add(std::move(tname));
    }
  }
  return { std::move(makeCommand) };
}